

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-matchers.h
# Opt level: O0

bool __thiscall
testing::internal::ElementsAreMatcherImpl<const_pstore::sstring_view<const_char_*>_&>::
MatchAndExplain(ElementsAreMatcherImpl<const_pstore::sstring_view<const_char_*>_&> *this,
               sstring_view<const_char_*> *container,MatchResultListener *listener)

{
  string *psVar1;
  pointer pMVar2;
  size_t sVar3;
  const_iterator pvVar4;
  pointer pMVar5;
  MatcherBase<const_char_&> *pMVar6;
  MatchResultListener *pMVar7;
  reference pvVar8;
  ostream *os;
  string *psVar9;
  ulong uVar10;
  bool bVar11;
  string *s_1;
  size_t i;
  undefined1 local_248 [3];
  bool reason_printed;
  pointer local_240;
  size_t actual_count;
  undefined1 local_218 [8];
  StringMatchResultListener s;
  bool match;
  pointer pMStack_78;
  bool mismatch_found;
  size_t exam_pos;
  const_iterator it;
  StlContainerReference stl_container;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_49;
  undefined1 local_48 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  explanations;
  bool listener_interested;
  MatchResultListener *listener_local;
  sstring_view<const_char_*> *container_local;
  ElementsAreMatcherImpl<const_pstore::sstring_view<const_char_*>_&> *this_local;
  
  explanations.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ =
       MatchResultListener::IsInterested(listener);
  sVar3 = count(this);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator(&local_49);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_48,sVar3,&local_49);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator(&local_49);
  it = (const_iterator)
       StlContainerView<pstore::sstring_view<const_char_*>_>::ConstReference(container);
  exam_pos = (size_t)pstore::sstring_view<const_char_*>::begin((sstring_view<const_char_*> *)it);
  pMStack_78 = (pointer)0x0;
  s._407_1_ = 0;
  while( true ) {
    sVar3 = exam_pos;
    pvVar4 = pstore::sstring_view<const_char_*>::end((sstring_view<const_char_*> *)it);
    pMVar2 = pMStack_78;
    bVar11 = false;
    if ((const_iterator)sVar3 != pvVar4) {
      pMVar5 = (pointer)count(this);
      bVar11 = pMVar2 != pMVar5;
    }
    if (!bVar11) goto LAB_0023c0f3;
    if ((explanations.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ & 1) == 0) {
      pMVar6 = &std::
                vector<testing::Matcher<const_char_&>,_std::allocator<testing::Matcher<const_char_&>_>_>
                ::operator[](&this->matchers_,(size_type)pMStack_78)->
                super_MatcherBase<const_char_&>;
      s._406_1_ = MatcherBase<const_char_&>::Matches(pMVar6,(char *)exam_pos);
    }
    else {
      StringMatchResultListener::StringMatchResultListener((StringMatchResultListener *)local_218);
      pMVar6 = &std::
                vector<testing::Matcher<const_char_&>,_std::allocator<testing::Matcher<const_char_&>_>_>
                ::operator[](&this->matchers_,(size_type)pMStack_78)->
                super_MatcherBase<const_char_&>;
      s._406_1_ = MatcherBase<const_char_&>::MatchAndExplain
                            (pMVar6,(char *)exam_pos,(MatchResultListener *)local_218);
      StringMatchResultListener::str_abi_cxx11_
                ((string *)&actual_count,(StringMatchResultListener *)local_218);
      pvVar8 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)local_48,(size_type)pMStack_78);
      std::__cxx11::string::operator=((string *)pvVar8,(string *)&actual_count);
      std::__cxx11::string::~string((string *)&actual_count);
      StringMatchResultListener::~StringMatchResultListener((StringMatchResultListener *)local_218);
    }
    if ((s._406_1_ & 1) == 0) break;
    exam_pos = exam_pos + 1;
    pMStack_78 = (pointer)((long)&(pMStack_78->super_MatcherBase<const_char_&>).
                                  super_MatcherDescriberInterface._vptr_MatcherDescriberInterface +
                          1);
  }
  s._407_1_ = 1;
LAB_0023c0f3:
  local_240 = pMStack_78;
  for (; sVar3 = exam_pos,
      pvVar4 = pstore::sstring_view<const_char_*>::end((sstring_view<const_char_*> *)it),
      pMVar2 = local_240, (const_iterator)sVar3 != pvVar4; exam_pos = exam_pos + 1) {
    local_240 = (pointer)((long)&(local_240->super_MatcherBase<const_char_&>).
                                 super_MatcherDescriberInterface._vptr_MatcherDescriberInterface + 1
                         );
  }
  pMVar5 = (pointer)count(this);
  if (pMVar2 == pMVar5) {
    if ((s._407_1_ & 1) == 0) {
      if ((explanations.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ & 1) != 0) {
        i._3_1_ = 0;
        for (s_1 = (string *)0x0; psVar1 = s_1, psVar9 = (string *)count(this), psVar1 != psVar9;
            s_1 = (string *)&s_1->field_0x1) {
          pvVar8 = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 *)local_48,(size_type)s_1);
          uVar10 = std::__cxx11::string::empty();
          if ((uVar10 & 1) == 0) {
            if ((i._3_1_ & 1) != 0) {
              MatchResultListener::operator<<(listener,(char (*) [7])",\nand ");
            }
            pMVar7 = MatchResultListener::operator<<(listener,(char (*) [16])"whose element #");
            pMVar7 = MatchResultListener::operator<<(pMVar7,(unsigned_long *)&s_1);
            pMVar7 = MatchResultListener::operator<<(pMVar7,(char (*) [11])" matches, ");
            MatchResultListener::operator<<(pMVar7,pvVar8);
            i._3_1_ = 1;
          }
        }
      }
      this_local._7_1_ = true;
    }
    else {
      if ((explanations.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ & 1) != 0) {
        pMVar7 = MatchResultListener::operator<<(listener,(char (*) [16])"whose element #");
        pMVar7 = MatchResultListener::operator<<(pMVar7,(unsigned_long *)&stack0xffffffffffffff88);
        MatchResultListener::operator<<(pMVar7,(char (*) [15])" doesn\'t match");
        pvVar8 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)local_48,(size_type)pMStack_78);
        os = MatchResultListener::stream(listener);
        PrintIfNotEmpty(pvVar8,os);
      }
      this_local._7_1_ = false;
    }
  }
  else {
    if (((explanations.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ & 1) != 0) &&
       (local_240 != (pointer)0x0)) {
      pMVar7 = MatchResultListener::operator<<(listener,(char (*) [11])"which has ");
      Elements((ElementsAreMatcherImpl<const_pstore::sstring_view<const_char_*>_&> *)local_248,
               (size_t)local_240);
      MatchResultListener::operator<<(pMVar7,(Message *)local_248);
      Message::~Message((Message *)local_248);
    }
    this_local._7_1_ = false;
  }
  i._4_4_ = 1;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_48);
  return this_local._7_1_;
}

Assistant:

bool MatchAndExplain(Container container,
                       MatchResultListener* listener) const override {
    // To work with stream-like "containers", we must only walk
    // through the elements in one pass.

    const bool listener_interested = listener->IsInterested();

    // explanations[i] is the explanation of the element at index i.
    ::std::vector<std::string> explanations(count());
    StlContainerReference stl_container = View::ConstReference(container);
    typename StlContainer::const_iterator it = stl_container.begin();
    size_t exam_pos = 0;
    bool mismatch_found = false;  // Have we found a mismatched element yet?

    // Go through the elements and matchers in pairs, until we reach
    // the end of either the elements or the matchers, or until we find a
    // mismatch.
    for (; it != stl_container.end() && exam_pos != count(); ++it, ++exam_pos) {
      bool match;  // Does the current element match the current matcher?
      if (listener_interested) {
        StringMatchResultListener s;
        match = matchers_[exam_pos].MatchAndExplain(*it, &s);
        explanations[exam_pos] = s.str();
      } else {
        match = matchers_[exam_pos].Matches(*it);
      }

      if (!match) {
        mismatch_found = true;
        break;
      }
    }
    // If mismatch_found is true, 'exam_pos' is the index of the mismatch.

    // Find how many elements the actual container has.  We avoid
    // calling size() s.t. this code works for stream-like "containers"
    // that don't define size().
    size_t actual_count = exam_pos;
    for (; it != stl_container.end(); ++it) {
      ++actual_count;
    }

    if (actual_count != count()) {
      // The element count doesn't match.  If the container is empty,
      // there's no need to explain anything as Google Mock already
      // prints the empty container.  Otherwise we just need to show
      // how many elements there actually are.
      if (listener_interested && (actual_count != 0)) {
        *listener << "which has " << Elements(actual_count);
      }
      return false;
    }

    if (mismatch_found) {
      // The element count matches, but the exam_pos-th element doesn't match.
      if (listener_interested) {
        *listener << "whose element #" << exam_pos << " doesn't match";
        PrintIfNotEmpty(explanations[exam_pos], listener->stream());
      }
      return false;
    }

    // Every element matches its expectation.  We need to explain why
    // (the obvious ones can be skipped).
    if (listener_interested) {
      bool reason_printed = false;
      for (size_t i = 0; i != count(); ++i) {
        const std::string& s = explanations[i];
        if (!s.empty()) {
          if (reason_printed) {
            *listener << ",\nand ";
          }
          *listener << "whose element #" << i << " matches, " << s;
          reason_printed = true;
        }
      }
    }
    return true;
  }